

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apted_tree_index_impl.h
# Opt level: O1

Matrix<double> * __thiscall
ted::APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>::
compute_opt_strategy_postL
          (Matrix<double> *__return_storage_ptr__,
          APTEDTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAPTED>
          *this,TreeIndexAPTED *t1,TreeIndexAPTED *t2)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer plVar5;
  undefined8 *puVar6;
  void *pvVar7;
  void *pvVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  pointer psVar10;
  vector<long_long,_std::allocator<long_long>_> *pvVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  _Elt_pointer psVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  size_t sVar20;
  uint uVar21;
  size_t sVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  int size2;
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  cost1_I;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> cost_Ipointer_parent_v;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> cost_Rpointer_parent_v;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> cost_Rpointer_v;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> cost_Lpointer_v;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> leafRow;
  vector<double,_std::allocator<double>_> cost2_path;
  vector<long_long,_std::allocator<long_long>_> cost2_I;
  vector<long_long,_std::allocator<long_long>_> cost2_R;
  vector<long_long,_std::allocator<long_long>_> cost2_L;
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  cost1_R;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> cost_Lpointer_parent_v;
  shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_> cost_Ipointer_v;
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  cost1_L;
  stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
  rowsToReuse_L;
  stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
  rowsToReuse_I;
  stack<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>_>
  rowsToReuse_R;
  int local_330;
  undefined1 local_329;
  vector<long_long,_std::allocator<long_long>_> *local_328;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_320;
  size_t local_318;
  Matrix<double> *local_310;
  ulong local_308;
  TreeIndexAPTED *local_300;
  long local_2f8;
  int local_2f0;
  int local_2ec;
  undefined1 local_2e8 [16];
  TreeIndexAPTED *local_2d0;
  long local_2c8;
  double local_2c0;
  size_t local_2b8;
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  local_2b0;
  element_type *local_298;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_290;
  element_type *local_288;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_280;
  element_type *local_278;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_270;
  element_type *local_268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_260 [2];
  vector<long_long,_std::allocator<long_long>_> *local_250;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_248;
  vector<double,_std::allocator<double>_> local_240;
  vector<long_long,_std::allocator<long_long>_> local_228;
  vector<long_long,_std::allocator<long_long>_> local_210;
  vector<long_long,_std::allocator<long_long>_> local_1f8;
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  local_1e0;
  element_type *local_1c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1c0;
  element_type *local_1b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1b0;
  long local_1a8;
  ulong local_1a0;
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  local_198;
  size_t local_180;
  size_t local_178;
  double local_170;
  size_t local_168;
  double local_160;
  longlong local_158;
  longlong local_150;
  longlong local_148;
  double local_140;
  long local_138;
  ulong local_130;
  _Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  local_128;
  _Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  local_d8;
  _Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  local_88;
  
  iVar2 = (t1->super_Constants).tree_size_;
  sVar22 = (size_t)iVar2;
  local_330 = (t2->super_Constants).tree_size_;
  data_structures::Matrix<double>::Matrix(__return_storage_ptr__,sVar22,(long)local_330);
  std::
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::vector(&local_198,sVar22,(allocator_type *)&local_128);
  std::
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::vector(&local_1e0,sVar22,(allocator_type *)&local_128);
  std::
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::vector(&local_2b0,sVar22,(allocator_type *)&local_128);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (&local_1f8,(long)local_330,(allocator_type *)&local_128);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (&local_210,(long)local_330,(allocator_type *)&local_128);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (&local_228,(long)local_330,(allocator_type *)&local_128);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_240,(long)local_330,(allocator_type *)&local_128);
  pvVar11 = (vector<long_long,_std::allocator<long_long>_> *)operator_new(0x18);
  std::vector<long_long,_std::allocator<long_long>_>::vector
            (pvVar11,(long)local_330,(allocator_type *)&local_128);
  local_250 = pvVar11;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::vector<long_long,std::allocator<long_long>>*>(&local_248,pvVar11);
  local_268 = (element_type *)0x0;
  a_Stack_260[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_278 = (element_type *)0x0;
  _Stack_270._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1b8 = (element_type *)0x0;
  _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1c8 = (element_type *)0x0;
  _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_288 = (element_type *)0x0;
  _Stack_280._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_298 = (element_type *)0x0;
  _Stack_290._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_128._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::_M_initialize_map(&local_128,0);
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::_M_initialize_map(&local_88,0);
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::_M_initialize_map(&local_d8,0);
  if (0 < iVar2) {
    local_2c0 = (double)iVar2;
    local_2ec = -1;
    sVar20 = 0;
    local_2f0 = -1;
    local_310 = __return_storage_ptr__;
    local_300 = t2;
    local_2d0 = t1;
    local_180 = sVar22;
    do {
      local_318 = (size_t)(local_2d0->super_PostLToPreL).postl_to_prel_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[sVar20];
      local_2b8 = (size_t)(local_2d0->super_PreLToParent).prel_to_parent_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[local_318];
      if (local_2b8 != 0xffffffffffffffff) {
        local_2f0 = (local_2d0->super_PreLToPostL).prel_to_postl_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[local_2b8];
      }
      uVar21 = (local_2d0->super_PreLToSize).prel_to_size_.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[local_318];
      local_308 = (ulong)uVar21;
      uVar21 = (local_2d0->super_PreRToPreL).prer_to_prel_.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[(long)(int)uVar21 +
                        (long)(local_2d0->super_PreLToPreR).prel_to_prer_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start[local_318] + -1];
      local_148 = (local_2d0->super_PreLToSpfCost).prel_to_cost_left_.
                  super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                  super__Vector_impl_data._M_start[local_318];
      local_150 = (local_2d0->super_PreLToSpfCost).prel_to_cost_right_.
                  super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                  super__Vector_impl_data._M_start[local_318];
      local_158 = (local_2d0->super_PreLToSpfCost).prel_to_cost_all_.
                  super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                  super__Vector_impl_data._M_start[local_318];
      if (local_308 == 1) {
        local_198.
        super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[sVar20].
        super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = local_250;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_198.
                    super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[sVar20].
                    super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,&local_248);
        local_1e0.
        super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[sVar20].
        super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = local_250;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_1e0.
                    super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[sVar20].
                    super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,&local_248);
        local_2b0.
        super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[sVar20].
        super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = local_250;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_2b0.
                    super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[sVar20].
                    super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,&local_248);
        if (0 < local_330) {
          local_2e8._0_8_ = (double)(int)local_318;
          lVar14 = 0;
          do {
            pdVar12 = data_structures::Matrix<double>::at
                                (__return_storage_ptr__,local_318,
                                 (long)(t2->super_PostLToPreL).postl_to_prel_.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[lVar14]);
            *pdVar12 = (double)local_2e8._0_8_;
            lVar14 = lVar14 + 1;
          } while (lVar14 < local_330);
        }
      }
      local_268 = local_198.
                  super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[sVar20].
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (a_Stack_260,
                 &local_198.
                  super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[sVar20].
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      local_278 = local_1e0.
                  super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[sVar20].
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&_Stack_270,
                 &local_1e0.
                  super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[sVar20].
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      local_1b8 = local_2b0.
                  super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[sVar20].
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
      local_2f8 = sVar20 * 0x10;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&_Stack_1b0,
                 &local_2b0.
                  super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[sVar20].
                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      lVar14 = (long)local_2f0;
      local_2c8 = lVar14;
      if ((int)local_2b8 != -1) {
        if (local_198.
            super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar14].
            super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr == (element_type *)0x0) {
          if (local_128._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_128._M_impl.super__Deque_impl_data._M_start._M_cur) {
            local_328 = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<std::vector<long_long,std::allocator<long_long>>,std::allocator<std::vector<long_long,std::allocator<long_long>>>,int_const&>
                      (&_Stack_320,&local_328,
                       (allocator<std::vector<long_long,_std::allocator<long_long>_>_> *)&local_329,
                       &local_330);
            _Var9._M_pi = _Stack_320._M_pi;
            pvVar11 = local_328;
            local_328 = (vector<long_long,_std::allocator<long_long>_> *)0x0;
            _Stack_320._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var4 = local_198.
                     super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar14].
                     super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            local_198.
            super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar14].
            super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = pvVar11;
            local_198.
            super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar14].
            super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = _Var9._M_pi;
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
            }
            if (_Stack_320._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_320._M_pi);
            }
            local_328 = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<std::vector<long_long,std::allocator<long_long>>,std::allocator<std::vector<long_long,std::allocator<long_long>>>,int_const&>
                      (&_Stack_320,&local_328,
                       (allocator<std::vector<long_long,_std::allocator<long_long>_>_> *)&local_329,
                       &local_330);
            _Var9._M_pi = _Stack_320._M_pi;
            pvVar11 = local_328;
            local_328 = (vector<long_long,_std::allocator<long_long>_> *)0x0;
            _Stack_320._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var4 = local_1e0.
                     super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar14].
                     super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            local_1e0.
            super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar14].
            super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = pvVar11;
            local_1e0.
            super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar14].
            super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = _Var9._M_pi;
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
            }
            if (_Stack_320._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_320._M_pi);
            }
            local_328 = (element_type *)0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<std::vector<long_long,std::allocator<long_long>>,std::allocator<std::vector<long_long,std::allocator<long_long>>>,int_const&>
                      (&_Stack_320,&local_328,
                       (allocator<std::vector<long_long,_std::allocator<long_long>_>_> *)&local_329,
                       &local_330);
            _Var9._M_pi = _Stack_320._M_pi;
            pvVar11 = local_328;
            local_328 = (vector<long_long,_std::allocator<long_long>_> *)0x0;
            _Stack_320._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var4 = local_2b0.
                     super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar14].
                     super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            local_2b0.
            super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar14].
            super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = pvVar11;
            local_2b0.
            super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar14].
            super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = _Var9._M_pi;
            if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
            }
            if (_Stack_320._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_320._M_pi);
            }
          }
          else {
            psVar16 = local_128._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_128._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_128._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar16 = local_128._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            local_198.
            super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar14].
            super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = psVar16[-1].
                      super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&local_198.
                        super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar14].
                        super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,
                       &psVar16[-1].
                        super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            psVar16 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar16 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            local_1e0.
            super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar14].
            super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = psVar16[-1].
                      super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&local_1e0.
                        super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar14].
                        super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,
                       &psVar16[-1].
                        super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            psVar16 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar16 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            local_2b0.
            super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar14].
            super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = psVar16[-1].
                      super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&local_2b0.
                        super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar14].
                        super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount,
                       &psVar16[-1].
                        super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            std::
            deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            ::pop_back((deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                        *)&local_128);
            std::
            deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            ::pop_back((deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                        *)&local_88);
            std::
            deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            ::pop_back((deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                        *)&local_d8);
          }
        }
        local_1c8 = local_198.
                    super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar14].
                    super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&_Stack_1c0,
                   &local_198.
                    super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar14].
                    super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        local_288 = local_1e0.
                    super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar14].
                    super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&_Stack_280,
                   &local_1e0.
                    super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar14].
                    super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        local_298 = local_2b0.
                    super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar14].
                    super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&_Stack_290,
                   &local_2b0.
                    super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar14].
                    super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        local_168 = local_2b8;
      }
      if (local_1f8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_1f8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        memset(local_1f8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Vector_impl_data._M_start,0,
               ((long)local_1f8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_finish +
                (-8 - (long)local_1f8.super__Vector_base<long_long,_std::allocator<long_long>_>.
                            _M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff8U) + 8);
      }
      if (local_210.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_210.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        memset(local_210.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Vector_impl_data._M_start,0,
               ((long)local_210.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_finish +
                (-8 - (long)local_210.super__Vector_base<long_long,_std::allocator<long_long>_>.
                            _M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff8U) + 8);
      }
      if (local_228.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_228.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        memset(local_228.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
               super__Vector_impl_data._M_start,0,
               ((long)local_228.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_finish +
                (-8 - (long)local_228.super__Vector_base<long_long,_std::allocator<long_long>_>.
                            _M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff8U) + 8);
      }
      if (local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        memset(local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,0,
               ((long)local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish +
                (-8 - (long)local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start) & 0xfffffffffffffff8U) + 8);
      }
      local_178 = sVar20;
      if (0 < local_330) {
        local_170 = (double)(int)~uVar21;
        local_160 = (double)((int)local_308 + (int)local_318);
        uVar19 = local_318 + 0x3f;
        if (-1 < (long)local_318) {
          uVar19 = local_318;
        }
        local_138 = (long)uVar19 >> 6;
        local_130 = 0x800000000000003f;
        local_1a0 = 1L << ((byte)local_318 & 0x3f);
        local_1a8 = (ulong)((local_318 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8;
        local_2c8 = local_2c8 << 4;
        lVar14 = 0;
        do {
          iVar2 = (t2->super_PostLToPreL).postl_to_prel_.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar14];
          uVar19 = (ulong)iVar2;
          iVar3 = (t2->super_PreLToParent).prel_to_parent_.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[uVar19];
          if ((long)iVar3 != -1) {
            local_2ec = (t2->super_PreLToPostL).prel_to_postl_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar3];
          }
          uVar21 = (t2->super_PreLToSize).prel_to_size_.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[uVar19];
          uVar17 = (ulong)uVar21;
          if (uVar17 == 1) {
            local_1f8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar14] = 0;
            local_210.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar14] = 0;
            local_228.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar14] = 0;
            local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar14] = (double)iVar2;
          }
          if (((int)(uint)local_308 < 2) || ((int)uVar21 < 2)) {
            if ((int)uVar21 < (int)(uint)local_308) {
              uVar21 = (uint)local_308;
            }
            lVar13 = (long)(int)uVar21;
            local_2e8 = ZEXT816(0xbff0000000000000);
          }
          else {
            lVar15 = (t2->super_PreLToSpfCost).prel_to_cost_left_.
                     super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar19] * local_308 +
                     (local_268->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar14];
            uVar23 = 0;
            uVar24 = 0xbff00000;
            if (lVar15 != 0x7fffffffffffffff) {
              uVar23 = SUB84(local_170,0);
              uVar24 = (undefined4)((ulong)local_170 >> 0x20);
            }
            lVar13 = (local_300->super_PreLToSpfCost).prel_to_cost_right_.
                     super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar19] * local_308 +
                     (local_278->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar14];
            local_2e8._0_8_ = local_160;
            if (lVar15 <= lVar13) {
              lVar13 = lVar15;
              local_2e8._0_8_ = CONCAT44(uVar24,uVar23);
            }
            local_2e8._8_8_ = 0;
            lVar15 = (local_300->super_PreLToSpfCost).prel_to_cost_all_.
                     super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar19] * local_308 +
                     (local_1b8->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar14];
            if (lVar15 < lVar13) {
              pdVar12 = data_structures::Matrix<double>::at(local_310,local_318,uVar19);
              local_2e8._8_8_ = 0;
              local_2e8._0_8_ = *pdVar12 + 1.0;
              lVar13 = lVar15;
            }
            lVar15 = local_148 * uVar17 +
                     local_1f8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar14];
            if (lVar15 < lVar13) {
              local_2e8._8_4_ = DAT_00123060._8_4_;
              local_2e8._0_8_ =
                   (ulong)((double)(local_300->super_PreRToPreL).prer_to_prel_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start
                                   [(long)(int)uVar21 +
                                    (long)(local_300->super_PreLToPreR).prel_to_prer_.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start[uVar19] + -1] + local_2c0
                          + 1.0) ^ (ulong)DAT_00123060;
              local_2e8._12_4_ = DAT_00123060._12_4_;
              lVar13 = lVar15;
            }
            lVar15 = local_150 * uVar17 +
                     local_210.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar14];
            if (lVar15 < lVar13) {
              local_2e8._8_8_ = 0;
              local_2e8._0_8_ = (double)(int)(iVar2 + uVar21 + -1) + local_2c0 + 1.0;
              lVar13 = lVar15;
            }
            lVar15 = uVar17 * local_158 +
                     local_228.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar14];
            if (lVar15 < lVar13) {
              local_2e8._8_8_ = 0;
              local_2e8._0_8_ =
                   local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar14] + local_2c0 + 1.0;
              lVar13 = lVar15;
            }
          }
          if ((int)local_2b8 != -1) {
            plVar1 = (local_288->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar14;
            *plVar1 = *plVar1 + lVar13;
            lVar15 = *(long *)(**(long **)((long)&((local_2b0.
                                                                                                        
                                                  super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + local_2f8) + lVar14 * 8) - lVar13;
            if (lVar15 < *(long *)(**(long **)((long)&((local_2b0.
                                                                                                                
                                                  super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + local_2c8) + lVar14 * 8)) {
              (local_298->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar14] = lVar15;
              pdVar12 = data_structures::Matrix<double>::read_at(local_310,local_318,uVar19);
              local_140 = *pdVar12;
              pdVar12 = data_structures::Matrix<double>::at(local_310,local_168,uVar19);
              *pdVar12 = local_140;
            }
            if ((*(ulong *)(local_1a8 +
                           (long)(local_2d0->super_PreLToTypeRight).prel_to_type_right_.
                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           local_138 * 8) & local_1a0) != 0) {
              plVar5 = (local_288->super__Vector_base<long_long,_std::allocator<long_long>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              plVar1 = (local_298->super__Vector_base<long_long,_std::allocator<long_long>_>).
                       _M_impl.super__Vector_impl_data._M_start + lVar14;
              *plVar1 = *plVar1 + plVar5[lVar14];
              plVar1 = plVar5 + lVar14;
              *plVar1 = *plVar1 + ((local_278->
                                   super__Vector_base<long_long,_std::allocator<long_long>_>).
                                   _M_impl.super__Vector_impl_data._M_start[lVar14] - lVar13);
            }
            lVar15 = lVar13;
            if ((*(ulong *)(local_1a8 +
                           local_138 * 8 +
                           (long)(local_2d0->super_PreLToTypeLeft).prel_to_type_left_.
                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) &
                local_1a0) != 0) {
              lVar15 = (local_268->super__Vector_base<long_long,_std::allocator<long_long>_>).
                       _M_impl.super__Vector_impl_data._M_start[lVar14];
            }
            plVar1 = (local_1c8->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar14;
            *plVar1 = *plVar1 + lVar15;
          }
          if (iVar3 != -1) {
            lVar15 = (long)local_2ec;
            local_210.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar15] =
                 local_210.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15] + lVar13;
            if (local_228.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar14] - lVar13 <
                local_228.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar15]) {
              local_228.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar15] =
                   local_228.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar14] - lVar13;
              local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar15] =
                   local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar14];
            }
            uVar17 = uVar19 + 0x3f;
            if (-1 < (long)uVar19) {
              uVar17 = uVar19;
            }
            lVar18 = ((long)uVar17 >> 6) * 8;
            uVar17 = (ulong)((uVar19 & local_130) < 0x8000000000000001);
            if ((*(ulong *)((long)(local_300->super_PreLToTypeRight).prel_to_type_right_.
                                  super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                            lVar18 + -8 + uVar17 * 8) >> (uVar19 & 0x3f) & 1) != 0) {
              local_228.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar15] =
                   local_228.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar15] +
                   local_210.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar15];
              local_210.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar15] =
                   local_210.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar15] +
                   (local_210.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar14] - lVar13);
            }
            if ((*(ulong *)(uVar17 * 8 + -8 +
                           lVar18 + (long)(local_300->super_PreLToTypeLeft).prel_to_type_left_.
                                          super__Bvector_base<std::allocator<bool>_>._M_impl.
                                          super__Bvector_impl_data._M_start.super__Bit_iterator_base
                                          ._M_p) & 1L << ((byte)iVar2 & 0x3f)) != 0) {
              lVar13 = local_1f8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar14];
            }
            local_1f8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar15] =
                 local_1f8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15] + lVar13;
          }
          pdVar12 = data_structures::Matrix<double>::at(local_310,local_318,uVar19);
          *pdVar12 = (double)local_2e8._0_8_;
          lVar14 = lVar14 + 1;
          t2 = local_300;
        } while (lVar14 < local_330);
      }
      sVar20 = local_178;
      sVar22 = local_180;
      psVar10 = local_198.
                super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __return_storage_ptr__ = local_310;
      if ((local_2d0->super_PreLToSize).prel_to_size_.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[local_318] != 1) {
        puVar6 = *(undefined8 **)
                  ((long)&((local_198.
                            super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr + local_2f8);
        pvVar7 = (void *)*puVar6;
        pvVar8 = (void *)puVar6[1];
        if (pvVar7 != pvVar8) {
          memset(pvVar7,0,((long)pvVar8 + (-8 - (long)pvVar7) & 0xfffffffffffffff8U) + 8);
        }
        puVar6 = *(undefined8 **)
                  ((long)&((local_1e0.
                            super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr + local_2f8);
        pvVar7 = (void *)*puVar6;
        pvVar8 = (void *)puVar6[1];
        if (pvVar7 != pvVar8) {
          memset(pvVar7,0,((long)pvVar8 + (-8 - (long)pvVar7) & 0xfffffffffffffff8U) + 8);
        }
        puVar6 = *(undefined8 **)
                  ((long)&((local_2b0.
                            super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr + local_2f8);
        pvVar7 = (void *)*puVar6;
        pvVar8 = (void *)puVar6[1];
        if (pvVar7 != pvVar8) {
          memset(pvVar7,0,((long)pvVar8 + (-8 - (long)pvVar7) & 0xfffffffffffffff8U) + 8);
        }
        lVar14 = local_2f8;
        std::
        deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ::push_back((deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     *)&local_128,
                    (value_type *)
                    ((long)&(psVar10->
                            super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr + local_2f8));
        std::
        deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ::push_back((deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     *)&local_88,
                    (value_type *)
                    ((long)&((local_1e0.
                              super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr + lVar14));
        std::
        deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
        ::push_back((deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     *)&local_d8,
                    (value_type *)
                    ((long)&((local_2b0.
                              super__Vector_base<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super___shared_ptr<std::vector<long_long,_std::allocator<long_long>_>,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr + lVar14));
      }
      sVar20 = sVar20 + 1;
    } while (sVar20 != sVar22);
  }
  std::
  deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::~deque((deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            *)&local_d8);
  std::
  deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::~deque((deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            *)&local_88);
  std::
  deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::~deque((deque<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
            *)&local_128);
  if (_Stack_290._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_290._M_pi);
  }
  if (_Stack_280._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_280._M_pi);
  }
  if (_Stack_1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1c0._M_pi);
  }
  if (_Stack_1b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1b0._M_pi);
  }
  if (_Stack_270._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_270._M_pi);
  }
  if (a_Stack_260[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_260[0]._M_pi);
  }
  if (local_248._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_248._M_pi);
  }
  if (local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_228.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_228.super__Vector_base<long_long,_std::allocator<long_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.super__Vector_base<long_long,_std::allocator<long_long>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_210.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_210.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_210.super__Vector_base<long_long,_std::allocator<long_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_210.super__Vector_base<long_long,_std::allocator<long_long>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1f8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f8.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.super__Vector_base<long_long,_std::allocator<long_long>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super__Vector_base<long_long,_std::allocator<long_long>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::~vector(&local_2b0);
  std::
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::~vector(&local_1e0);
  std::
  vector<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::shared_ptr<std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::~vector(&local_198);
  return __return_storage_ptr__;
}

Assistant:

data_structures::Matrix<double> APTEDTreeIndex<CostModel, TreeIndex>::compute_opt_strategy_postL(const TreeIndex& t1, const TreeIndex& t2) {
  const int size1 = t1.tree_size_;
  const int size2 = t2.tree_size_;
  data_structures::Matrix<double> strategy(size1, size2);
  std::vector<std::shared_ptr<std::vector<long long int>>> cost1_L(size1);
  std::vector<std::shared_ptr<std::vector<long long int>>> cost1_R(size1);
  std::vector<std::shared_ptr<std::vector<long long int>>> cost1_I(size1);
  std::vector<long long int> cost2_L(size2);
  std::vector<long long int> cost2_R(size2);
  std::vector<long long int> cost2_I(size2);
  std::vector<double> cost2_path(size2);
  std::shared_ptr<std::vector<long long int>> leafRow(new std::vector<long long int>(size2));
  double pathIDOffset = static_cast<double>(size1);
  long long int minCost = std::numeric_limits<long long int>::max();
  double strategyPath = -1.0;

  const std::vector<int>& pre2size1 = t1.prel_to_size_;
  const std::vector<int>& pre2size2 = t2.prel_to_size_;
  const std::vector<long long int>& pre2descSum1 = t1.prel_to_cost_all_;
  const std::vector<long long int>& pre2descSum2 = t2.prel_to_cost_all_;
  const std::vector<long long int>& pre2krSum1 = t1.prel_to_cost_left_;
  const std::vector<long long int>& pre2krSum2 = t2.prel_to_cost_left_;
  const std::vector<long long int>& pre2revkrSum1 = t1.prel_to_cost_right_;
  const std::vector<long long int>& pre2revkrSum2 = t2.prel_to_cost_right_;
  const std::vector<int>& preL_to_preR_1 = t1.prel_to_prer_;
  const std::vector<int>& preL_to_preR_2 = t2.prel_to_prer_;
  const std::vector<int>& preR_to_preL_1 = t1.prer_to_prel_;
  const std::vector<int>& preR_to_preL_2 = t2.prer_to_prel_;
  const std::vector<int>& pre2parent1 = t1.prel_to_parent_;
  const std::vector<int>& pre2parent2 = t2.prel_to_parent_;
  const std::vector<bool>& nodeType_L_1 = t1.prel_to_type_left_;
  const std::vector<bool>& nodeType_L_2 = t2.prel_to_type_left_;
  const std::vector<bool>& nodeType_R_1 = t1.prel_to_type_right_;
  const std::vector<bool>& nodeType_R_2 = t2.prel_to_type_right_;

  const std::vector<int>& preL_to_postL_1 = t1.prel_to_postl_;
  const std::vector<int>& preL_to_postL_2 = t2.prel_to_postl_;

  const std::vector<int>& postL_to_preL_1 = t1.postl_to_prel_;
  const std::vector<int>& postL_to_preL_2 = t2.postl_to_prel_;

  int size_v = -1;
  int parent_v_preL = -1;
  int parent_w_preL = -1;
  int parent_w_postL = -1;
  int size_w = -1;
  int parent_v_postL = -1;
  double leftPath_v;
  double rightPath_v;
  std::shared_ptr<std::vector<long long int>> cost_Lpointer_v;
  std::shared_ptr<std::vector<long long int>> cost_Rpointer_v;
  std::shared_ptr<std::vector<long long int>> cost_Ipointer_v;
  // std::vector<double>* strategypointer_v;
  std::size_t strategypointer_v;
  std::shared_ptr<std::vector<long long int>> cost_Lpointer_parent_v;
  std::shared_ptr<std::vector<long long int>> cost_Rpointer_parent_v;
  std::shared_ptr<std::vector<long long int>> cost_Ipointer_parent_v;
  // std::vector<double>* strategypointer_parent_v;
  std::size_t strategypointer_parent_v;
  long long int krSum_v;
  long long int revkrSum_v;
  long long int descSum_v;
  bool is_v_leaf;

  int v_in_preL;
  int w_in_preL;

  std::stack<std::shared_ptr<std::vector<long long int>>> rowsToReuse_L;
  std::stack<std::shared_ptr<std::vector<long long int>>> rowsToReuse_R;
  std::stack<std::shared_ptr<std::vector<long long int>>> rowsToReuse_I;

  for(int v = 0; v < size1; ++v) {
    v_in_preL = postL_to_preL_1[v];

    is_v_leaf = t1.prel_to_size_[v_in_preL] == 1;
    parent_v_preL = pre2parent1[v_in_preL];

    if (parent_v_preL != -1) {
      parent_v_postL = preL_to_postL_1[parent_v_preL];
    }

    // strategypointer_v = strategy[v_in_preL];
    strategypointer_v = v_in_preL;

    size_v = pre2size1[v_in_preL];
    leftPath_v = static_cast<double>(-(preR_to_preL_1[preL_to_preR_1[v_in_preL] + size_v - 1] + 1));// this is the left path's ID which is the leftmost leaf node: l-r_preorder(r-l_preorder(v) + |Fv| - 1)
    rightPath_v = static_cast<double>(v_in_preL + size_v - 1 + 1); // this is the right path's ID which is the rightmost leaf node: l-r_preorder(v) + |Fv| - 1

    krSum_v = pre2krSum1[v_in_preL];
    revkrSum_v = pre2revkrSum1[v_in_preL];
    descSum_v = pre2descSum1[v_in_preL];

    if(is_v_leaf) {
      cost1_L[v] = leafRow;
      cost1_R[v] = leafRow;
      cost1_I[v] = leafRow;
      for(int i = 0; i < size2; ++i) {
        // strategypointer_v[postL_to_preL_2[i]] = v_in_preL;
        strategy.at(strategypointer_v, postL_to_preL_2[i]) = static_cast<double>(v_in_preL);
      }
    }

    cost_Lpointer_v = cost1_L[v];
    cost_Rpointer_v = cost1_R[v];
    cost_Ipointer_v = cost1_I[v];

    if(parent_v_preL != -1 && cost1_L[parent_v_postL] == nullptr) {
      if (rowsToReuse_L.empty()) {
        cost1_L[parent_v_postL] = std::make_shared<std::vector<long long int>>(size2);
        cost1_R[parent_v_postL] = std::make_shared<std::vector<long long int>>(size2);
        cost1_I[parent_v_postL] = std::make_shared<std::vector<long long int>>(size2);
      } else {
        cost1_L[parent_v_postL] = rowsToReuse_L.top();
        cost1_R[parent_v_postL] = rowsToReuse_R.top();
        cost1_I[parent_v_postL] = rowsToReuse_I.top();
        rowsToReuse_L.pop();
        rowsToReuse_R.pop();
        rowsToReuse_I.pop();
      }
    }

    if (parent_v_preL != -1) {
      cost_Lpointer_parent_v = cost1_L[parent_v_postL];
      cost_Rpointer_parent_v = cost1_R[parent_v_postL];
      cost_Ipointer_parent_v = cost1_I[parent_v_postL];
      // strategypointer_parent_v = strategy[parent_v_preL];
      strategypointer_parent_v = parent_v_preL;
    }

    // Arrays.fill(cost2_L, 0L);
    std::fill(cost2_L.begin(),cost2_L.end(), 0);
    // Arrays.fill(cost2_R, 0L);
    std::fill(cost2_R.begin(),cost2_R.end(), 0);
    // Arrays.fill(cost2_I, 0L);
    std::fill(cost2_I.begin(),cost2_I.end(), 0);
    // Arrays.fill(cost2_path, 0);
    std::fill(cost2_path.begin(),cost2_path.end(), 0);

    for(int w = 0; w < size2; ++w) {
      w_in_preL = postL_to_preL_2[w];

      parent_w_preL = pre2parent2[w_in_preL];
      if (parent_w_preL != -1) {
        parent_w_postL = preL_to_postL_2[parent_w_preL];
      }

      size_w = pre2size2[w_in_preL];
      if (t2.prel_to_size_[w_in_preL] == 1) {
        cost2_L[w] = 0;
        cost2_R[w] = 0;
        cost2_I[w] = 0;
        cost2_path[w] = w_in_preL;
      }
      minCost = std::numeric_limits<long long int>::max();
      strategyPath = -1.0;
      long long int tmpCost = std::numeric_limits<long long int>::max();

      if (size_v <= 1 || size_w <= 1) { // USE NEW SINGLE_PATH FUNCTIONS FOR SMALL SUBTREES
        minCost = std::max(size_v, size_w);
      } else {
        tmpCost = size_v * pre2krSum2[w_in_preL] + (*cost_Lpointer_v)[w];
        // std::cout << "tmpCost [1] = " << tmpCost << std::endl;
        if (tmpCost < minCost) {
          minCost = tmpCost;
          strategyPath = leftPath_v;
          // std::cout << "strategyPath [1] = " << strategyPath << std::endl;
        }
        tmpCost = size_v * pre2revkrSum2[w_in_preL] + (*cost_Rpointer_v)[w];
        // std::cout << "tmpCost [2] = " << tmpCost << std::endl;
        if (tmpCost < minCost) {
          minCost = tmpCost;
          strategyPath = rightPath_v;
          // std::cout << "strategyPath [2] = " << strategyPath << std::endl;
        }
        tmpCost = size_v * pre2descSum2[w_in_preL] + (*cost_Ipointer_v)[w];
        // std::cout << "tmpCost [3] = " << tmpCost << std::endl;
        if (tmpCost < minCost) {
          minCost = tmpCost;
          // strategyPath = (int)strategypointer_v[w_in_preL] + 1;
          strategyPath = strategy.at(strategypointer_v, w_in_preL) + 1.0;
          // std::cout << "strategyPath [3] = " << strategyPath << std::endl;
        }
        tmpCost = size_w * krSum_v + cost2_L[w];
        // std::cout << "tmpCost [4] = " << tmpCost << std::endl;
        if (tmpCost < minCost) {
          minCost = tmpCost;
          strategyPath = static_cast<double>(-(preR_to_preL_2[preL_to_preR_2[w_in_preL] + size_w - 1] + pathIDOffset + 1.0));
          // std::cout << "strategyPath [4] = " << strategyPath << std::endl;
        }
        tmpCost = size_w * revkrSum_v + cost2_R[w];
        // std::cout << "tmpCost [5] = " << tmpCost << std::endl;
        if (tmpCost < minCost) {
          minCost = tmpCost;
          strategyPath = static_cast<double>(w_in_preL + size_w - 1) + pathIDOffset + 1.0;
          // std::cout << "strategyPath [5] = " << strategyPath << std::endl;
        }
        tmpCost = size_w * descSum_v + cost2_I[w];
        // std::cout << "tmpCost [6] = " << tmpCost << std::endl;
        if (tmpCost < minCost) {
          minCost = tmpCost;
          strategyPath = cost2_path[w] + pathIDOffset + 1.0;
          // std::cout << "strategyPath [6] = " << strategyPath << std::endl;
        }
      }

      // std::cout << "minCost = " << minCost << std::endl;

      if (parent_v_preL != -1) {
        (*cost_Rpointer_parent_v)[w] += minCost;
        tmpCost = -minCost + (*cost1_I[v])[w];
        if (tmpCost < (*cost1_I[parent_v_postL])[w]) {
          (*cost_Ipointer_parent_v)[w] = tmpCost;
          // strategypointer_parent_v[w_in_preL] = strategypointer_v[w_in_preL];
          strategy.at(strategypointer_parent_v, w_in_preL) = strategy.read_at(strategypointer_v, w_in_preL);
        }
        if (nodeType_R_1[v_in_preL]) {
          (*cost_Ipointer_parent_v)[w] += (*cost_Rpointer_parent_v)[w];
          (*cost_Rpointer_parent_v)[w] += (*cost_Rpointer_v)[w] - minCost;
        }
        if (nodeType_L_1[v_in_preL]) {
          (*cost_Lpointer_parent_v)[w] += (*cost_Lpointer_v)[w];
        } else {
          (*cost_Lpointer_parent_v)[w] += minCost;
        }
      }
      if (parent_w_preL != -1) {
        cost2_R[parent_w_postL] += minCost;
        tmpCost = -minCost + cost2_I[w];
        if (tmpCost < cost2_I[parent_w_postL]) {
          cost2_I[parent_w_postL] = tmpCost;
          cost2_path[parent_w_postL] = cost2_path[w];
        }
        if (nodeType_R_2[w_in_preL]) {
          cost2_I[parent_w_postL] += cost2_R[parent_w_postL];
          cost2_R[parent_w_postL] += cost2_R[w] - minCost;
        }
        if (nodeType_L_2[w_in_preL]) {
          cost2_L[parent_w_postL] += cost2_L[w];
        } else {
          cost2_L[parent_w_postL] += minCost;
        }
      }
      // strategypointer_v[w_in_preL] = strategyPath;
      strategy.at(strategypointer_v, w_in_preL) = strategyPath;
      // std::cout << "strategy[" << strategypointer_v << "," << w_in_preL << "] = " << strategy.read_at(0, 0) << std::endl;
    }

    if (!(t1.prel_to_size_[v_in_preL] == 1)) {
      // Arrays.fill(cost1_L[v], 0);
      std::fill(cost1_L[v]->begin(), cost1_L[v]->end(), 0.0);
      // Arrays.fill(cost1_R[v], 0);
      std::fill(cost1_R[v]->begin(), cost1_R[v]->end(), 0.0);
      // Arrays.fill(cost1_I[v], 0);
      std::fill(cost1_I[v]->begin(), cost1_I[v]->end(), 0.0);
      rowsToReuse_L.push(cost1_L[v]);
      rowsToReuse_R.push(cost1_R[v]);
      rowsToReuse_I.push(cost1_I[v]);
      // NOTE: The pointers under cost1_L[v] do not have to be nulled.
    }

  }
  
  // std::cout << "strategy[0][0] = " << strategy.read_at(0, 0) << std::endl;
  return strategy;
}